

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallFileGenerator::HandleMissingTarget
          (cmExportInstallFileGenerator *this,string *link_libs,cmGeneratorTarget *depender,
          cmGeneratorTarget *dependee)

{
  cmExportInstallFileGenerator *this_00;
  cmLocalGenerator *pcVar1;
  string missingTarget;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  exportInfo;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  string local_98;
  undefined1 local_78 [56];
  string local_40;
  
  this_00 = (cmExportInstallFileGenerator *)cmGeneratorTarget::GetName_abi_cxx11_(dependee);
  std::__cxx11::string::string((string *)&local_40,(string *)this_00);
  pcVar1 = cmGeneratorTarget::GetLocalGenerator(dependee);
  FindNamespaces((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_78,this_00,pcVar1->GlobalGenerator,&local_40);
  if (local_78._8_8_ - local_78._0_8_ == 0x20) {
    std::__cxx11::string::string((string *)&bStack_b8,(string *)(local_78 + 0x18));
    cmGeneratorTarget::GetExportName_abi_cxx11_(&local_98,dependee);
    std::__cxx11::string::append((string *)&bStack_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::append((string *)link_libs);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &(this->super_cmExportFileGenerator).MissingTargets,&bStack_b8);
    std::__cxx11::string::~string((string *)&bStack_b8);
  }
  else {
    ComplainAboutMissingTarget
              (this,depender,dependee,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_78);
  }
  std::
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_78);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmExportInstallFileGenerator::HandleMissingTarget(
  std::string& link_libs, cmGeneratorTarget const* depender,
  cmGeneratorTarget* dependee)
{
  const std::string name = dependee->GetName();
  cmGlobalGenerator* gg = dependee->GetLocalGenerator()->GetGlobalGenerator();
  auto exportInfo = this->FindNamespaces(gg, name);
  std::vector<std::string> const& exportFiles = exportInfo.first;
  if (exportFiles.size() == 1) {
    std::string missingTarget = exportInfo.second;

    missingTarget += dependee->GetExportName();
    link_libs += missingTarget;
    this->MissingTargets.emplace_back(std::move(missingTarget));
  } else {
    // All exported targets should be known here and should be unique.
    // This is probably user-error.
    this->ComplainAboutMissingTarget(depender, dependee, exportFiles);
  }
}